

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O1

GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
 BCL::
 local_malloc<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>>
           (size_t size)

{
  HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  *pHVar1;
  ulong uVar2;
  HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  *pHVar3;
  long *plVar4;
  uint uVar5;
  int iVar6;
  ulong *puVar7;
  size_t sVar8;
  ulong *puVar9;
  HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  *pHVar10;
  undefined4 extraout_var;
  runtime_error *this;
  size_t extraout_RDX;
  ulong *puVar11;
  size_t sVar12;
  size_t *psVar13;
  GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
  *this_00;
  ulong uVar14;
  GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
  GVar15;
  GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
  GVar16;
  
  if (bcl_finalized == '\0') {
    uVar5 = pthread_mutex_lock((pthread_mutex_t *)malloc_mutex);
    puVar9 = smem_heap;
    if (uVar5 != 0) {
      this_00 = (GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
                 *)(ulong)uVar5;
      GVar16 = (GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
                )std::__throw_system_error(uVar5);
      if (bcl_finalized != '\0') {
        return GVar16;
      }
      iVar6 = pthread_mutex_lock((pthread_mutex_t *)malloc_mutex);
      if (iVar6 != 0) {
        std::__throw_system_error(iVar6);
LAB_00104aa2:
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this,"AGH!!!! What a world, what a world! This was never supposed to happen.\n");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pHVar10 = GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
                ::local(this_00);
      if (pHVar10 !=
          (HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
           *)0x0) {
        pHVar1 = pHVar10 + -2;
        psVar13 = (size_t *)&flist;
        do {
          pHVar3 = (HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
                    *)*psVar13;
          if (pHVar3 == (HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
                         *)0x0) break;
          psVar13 = &(pHVar3->key).len;
        } while (pHVar1 <= pHVar3);
        if (pHVar3 == (HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
                       *)0x0) {
          puVar9 = (ulong *)&flist;
          pHVar10[-2].key.len = (size_t)flist;
          pHVar10[-2].key.ptr.ptr = 0;
          if (flist != (ulong *)0x0) {
            flist[1] = (ulong)pHVar1;
          }
        }
        else {
          if (pHVar1 <= pHVar3) goto LAB_00104aa2;
          sVar8 = (pHVar3->key).len;
          pHVar10[-2].key.len = sVar8;
          pHVar10[-2].key.ptr.ptr = (size_t)pHVar3;
          if (sVar8 != 0) {
            *(HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
              **)(sVar8 + 8) = pHVar1;
          }
          puVar9 = (ulong *)(pHVar10[-2].key.ptr.ptr + 0x10);
        }
        *puVar9 = (ulong)pHVar1;
        sVar8 = pHVar10[-2].key.ptr.rank;
        plVar4 = (long *)pHVar10[-2].key.len;
        if (plVar4 == (long *)((long)&(pHVar10->key).ptr.rank + sVar8)) {
          pHVar10[-2].key.ptr.rank = sVar8 + *plVar4 + 0x40;
          sVar8 = plVar4[2];
          pHVar10[-2].key.len = sVar8;
          if (sVar8 != 0) {
            *(HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
              **)(sVar8 + 8) = pHVar1;
          }
        }
        plVar4 = (long *)pHVar10[-2].key.ptr.ptr;
        if ((plVar4 != (long *)0x0) &&
           (pHVar1 == (HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
                       *)plVar4[2] &&
            (HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
             *)((long)plVar4 + *plVar4 + 0x40) ==
            (HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
             *)plVar4[2])) {
          *plVar4 = pHVar10[-2].key.ptr.rank + *plVar4 + 0x40;
          sVar8 = pHVar10[-2].key.len;
          plVar4[2] = sVar8;
          if (sVar8 != 0) {
            *(long **)(sVar8 + 8) = plVar4;
          }
        }
      }
      GVar16.rank._0_4_ = pthread_mutex_unlock((pthread_mutex_t *)malloc_mutex);
      GVar16.rank._4_4_ = extraout_var;
      GVar16.ptr = extraout_RDX;
      return GVar16;
    }
    uVar14 = size * 0x20 + 0x3f & 0xffffffffffffffc0;
    for (puVar11 = flist; puVar11 != (ulong *)0x0; puVar11 = (ulong *)puVar11[2]) {
      uVar2 = *puVar11;
      if (uVar14 <= uVar2) {
        if (uVar14 + 0x80 < uVar2) {
          puVar9 = (ulong *)((long)puVar11 + uVar14 + 0x40);
          *puVar9 = (uVar2 - uVar14) - 0x40;
          *(ulong *)((long)puVar11 + uVar14 + 0x48) = puVar11[1];
          *(ulong *)((long)puVar11 + uVar14 + 0x50) = puVar11[2];
          if (puVar11[1] != 0) {
            *(ulong **)(puVar11[1] + 0x10) = puVar9;
          }
          if (puVar11[2] != 0) {
            *(ulong **)(puVar11[2] + 8) = puVar9;
          }
          *puVar11 = uVar14;
          puVar11[1] = 0;
          puVar11[2] = 0;
          puVar7 = smem_heap;
          if (puVar11 == flist) {
            flist = puVar9;
          }
        }
        else {
          uVar14 = puVar11[1];
          if (uVar14 != 0) {
            *(ulong *)(uVar14 + 0x10) = puVar11[2];
          }
          puVar9 = (ulong *)puVar11[2];
          if (puVar9 != (ulong *)0x0) {
            puVar9[1] = uVar14;
          }
          if (puVar11 == flist) {
            flist = puVar9;
          }
          puVar11[1] = 0;
          puVar11[2] = 0;
          puVar7 = smem_heap;
        }
        goto LAB_00104935;
      }
    }
    *smem_heap = uVar14;
    puVar7 = (ulong *)((long)puVar9 + uVar14 + 0x40);
    puVar9[1] = 0;
    puVar9[2] = 0;
    puVar11 = puVar9;
    if (puVar7 <= (ulong *)(smem_base_ptr + shared_segment_size)) {
LAB_00104935:
      smem_heap = puVar7;
      pthread_mutex_unlock((pthread_mutex_t *)malloc_mutex);
      sVar12 = (long)puVar11 + (0x40 - smem_base_ptr);
      sVar8 = my_rank;
      goto LAB_0010494f;
    }
    pthread_mutex_unlock((pthread_mutex_t *)malloc_mutex);
  }
  sVar8 = 0;
  sVar12 = 0;
LAB_0010494f:
  GVar15.ptr = sVar12;
  GVar15.rank = sVar8;
  return GVar15;
}

Assistant:

inline GlobalPtr <T> local_malloc(size_t size) {
  if (bcl_finalized) {
    return nullptr;
  }
  BCL::malloc_mutex.lock();
  size = size * sizeof(T);
  // Align size
  size = ((size + SMALLEST_MEM_UNIT - 1) / SMALLEST_MEM_UNIT) * SMALLEST_MEM_UNIT;

  chunk_t *chunk = flist;

  while (chunk != NULL) {
    if (chunk->size >= size) {
      break;
    }
    chunk = chunk->next;
  }

  char *allocd = nullptr;
  if (chunk != NULL && chunk->size >= size) {
    // I have a chunk!
    if (chunk->size > SMALLEST_MEM_UNIT + size + chunk_t_size()) {
      // Chunk is too big; carve off my piece and
      // replace it with free_chunk in the flist.
      chunk_t *free_chunk = (chunk_t *) (((char *) chunk) + chunk_t_size() + size);
      free_chunk->size = chunk->size - size - chunk_t_size();
      free_chunk->last = chunk->last;
      free_chunk->next = chunk->next;
      if (chunk->last != NULL) {
        chunk->last->next = free_chunk;
      }
      if (chunk->next != NULL) {
        chunk->next->last = free_chunk;
      }
      chunk->size = size;
      chunk->next = NULL;
      chunk->last = NULL;
      if (chunk == flist) {
        flist = free_chunk;
      }
    } else {
      // Chunk is just the right size; carve it
      // off and close the hole in the flist.
      if (chunk->last != NULL) {
        chunk->last->next = chunk->next;
      }
      if (chunk->next != NULL) {
        chunk->next->last = chunk->last;
      }
      if (chunk == flist) {
        flist = chunk->next;
      }
      chunk->last = NULL;
      chunk->next = NULL;
    }
    allocd = ((char *) chunk) + chunk_t_size();
  } else {
    // No free chunk, carve one off the heap.
    chunk = BCL::smem_heap;
    chunk->size = size;
    chunk->next = NULL;
    chunk->last = NULL;
    allocd = ((char *) chunk) + chunk_t_size();
    if (allocd + size > ((char *) BCL::smem_base_ptr) + shared_segment_size) {
      BCL::malloc_mutex.unlock();
      return nullptr;
    } else {
      BCL::smem_heap = (chunk_t *) (((char *) allocd) + size);
    }
  }

  BCL::malloc_mutex.unlock();

  return GlobalPtr <T> (BCL::rank(), (uint64_t) (allocd - (char *) BCL::smem_base_ptr));
}